

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.c
# Opt level: O3

int testAlphabetAssertion(char *msg,int condition,char *format,int a)

{
  int in_EAX;
  int iVar1;
  
  if (condition != 0) {
    return in_EAX;
  }
  pthread_mutex_lock((pthread_mutex_t *)&mutex);
  nrErrors = nrErrors + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&mutex);
  printf("*** ERROR *** %s, ",msg);
  printf("alphabet=%d",(ulong)format & 0xffffffff);
  iVar1 = putchar(10);
  return iVar1;
}

Assistant:

static int testAlphabetAssertion(char *msg, int condition, char *format, int a) {
    if (condition == 0) {
        foundError();
        printf("*** ERROR *** %s, ", msg);
        printf(format, a);
        printf("\n");
    }
    return 1;
}